

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_exception.h
# Opt level: O0

void __thiscall binpac::Exception::Exception(Exception *this,char *m)

{
  string *in_RSI;
  allocator<char> *this_00;
  allocator<char> local_49;
  string local_48 [8];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_11;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(&local_11);
  if (local_10 != (string *)0x0) {
    this_00 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    append((Exception *)this_00,local_10);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

Exception(const char* m = 0) : msg_("binpac exception: ")
		{
		if ( m )
			append(m);
		// abort();
		}